

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::PrimitiveInstantiationSyntax::PrimitiveInstantiationSyntax
          (PrimitiveInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token type,
          NetStrengthSyntax *strength,TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  HierarchicalInstanceSyntax *pHVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  size_t index;
  
  uVar6 = type._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = PrimitiveInstantiation;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar8 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->type).kind = (short)uVar6;
  (this->type).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->type).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->type).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->type).info = type.info;
  this->strength = strength;
  this->delay = delay;
  SVar3 = (instances->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(instances->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent =
       (instances->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->instances).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->instances).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->instances).super_SyntaxListBase.childCount = (instances->super_SyntaxListBase).childCount;
  (this->instances).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ea3c8
  ;
  sVar1 = (instances->elements).size_;
  (this->instances).elements.data_ = (instances->elements).data_;
  (this->instances).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (strength != (NetStrengthSyntax *)0x0) {
    (strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (delay != (TimingControlSyntax *)0x0) {
    (delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->instances).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pHVar5 = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::operator[]
                         (&this->instances,index);
      (pHVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

PrimitiveInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token type, NetStrengthSyntax* strength, TimingControlSyntax* delay, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::PrimitiveInstantiation, attributes), type(type), strength(strength), delay(delay), instances(instances), semi(semi) {
        if (this->strength) this->strength->parent = this;
        if (this->delay) this->delay->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }